

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightVectorPhrase.hpp
# Opt level: O1

string * __thiscall
wv::WeightVectorPhrase::getConcreteCoord_abi_cxx11_
          (string *__return_storage_ptr__,WeightVectorPhrase *this,uint32_t number)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  
  pbVar1 = (this->m_Coords).m_MasPoint;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = pbVar1[number]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar1[number]._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string getConcreteCoord(uint32_t number) const
        {
            return m_Coords[number]; //m_Coords.at(number); 
        }